

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_blob_reopen(sqlite3_blob *pBlob,sqlite3_int64 iRow)

{
  uint uVar1;
  char *zFormat;
  long in_RDI;
  long in_FS_OFFSET;
  Incrblob *unaff_retaddr;
  sqlite3 *db;
  Incrblob *p;
  int rc;
  char *zErr;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  sqlite3 *db_00;
  int local_14;
  undefined1 *puVar2;
  sqlite3_int64 iRow_00;
  
  iRow_00 = *(sqlite3_int64 *)(in_FS_OFFSET + 0x28);
  if (in_RDI == 0) {
    local_14 = sqlite3MisuseError(0);
  }
  else {
    db_00 = *(sqlite3 **)(in_RDI + 0x20);
    sqlite3_mutex_enter((sqlite3_mutex *)0x144948);
    if (*(long *)(in_RDI + 0x18) != 0) {
      puVar2 = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x34) = 0;
      uVar1 = blobSeekToRow(unaff_retaddr,iRow_00,(char **)&DAT_aaaaaaaaaaaaaaaa);
      if (uVar1 != 0) {
        zFormat = (char *)0x0;
        if (puVar2 != (undefined1 *)0x0) {
          zFormat = "%s";
        }
        sqlite3ErrorWithMsg(db_00,(int)(ulong)uVar1,zFormat,puVar2);
        sqlite3DbFree(db_00,(void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      }
    }
    local_14 = sqlite3ApiExit((sqlite3 *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    sqlite3_mutex_leave((sqlite3_mutex *)0x1449fa);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != iRow_00) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

SQLITE_API int sqlite3_blob_reopen(sqlite3_blob *pBlob, sqlite3_int64 iRow){
  int rc;
  Incrblob *p = (Incrblob *)pBlob;
  sqlite3 *db;

  if( p==0 ) return SQLITE_MISUSE_BKPT;
  db = p->db;
  sqlite3_mutex_enter(db->mutex);

  if( p->pStmt==0 ){
    /* If there is no statement handle, then the blob-handle has
    ** already been invalidated. Return SQLITE_ABORT in this case.
    */
    rc = SQLITE_ABORT;
  }else{
    char *zErr;
    ((Vdbe*)p->pStmt)->rc = SQLITE_OK;
    rc = blobSeekToRow(p, iRow, &zErr);
    if( rc!=SQLITE_OK ){
      sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : (char*)0), zErr);
      sqlite3DbFree(db, zErr);
    }
    assert( rc!=SQLITE_SCHEMA );
  }

  rc = sqlite3ApiExit(db, rc);
  assert( rc==SQLITE_OK || p->pStmt==0 );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}